

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O1

bool __thiscall
directed_flag_complex_in_memory_computer::
coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::has_next(coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  ulong uVar1;
  ulong uVar2;
  _Elt_pointer piVar3;
  const_iterator local_58;
  const_iterator local_38;
  
  if ((long)this->index != 0xffffffffffffffff) {
    compressed_sparse_matrix<int>::cbegin(&local_58,this->matrix,(long)this->index);
    uVar2 = ((long)local_58._M_cur - (long)local_58._M_first >> 2) + this->current_offset;
    if (uVar2 < 0x80) {
      piVar3 = local_58._M_cur + this->current_offset;
    }
    else {
      uVar1 = uVar2 >> 7 | 0xfe00000000000000;
      if (0 < (long)uVar2) {
        uVar1 = uVar2 >> 7;
      }
      piVar3 = local_58._M_node[uVar1] + uVar2 + uVar1 * -0x80;
    }
    compressed_sparse_matrix<int>::cend(&local_38,this->matrix,(long)this->index);
    return piVar3 != local_38._M_cur;
  }
  return false;
}

Assistant:

bool has_next() { return index != -1 && matrix.cbegin(index) + current_offset != matrix.cend(index); }